

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgidt(fitsfile *fptr,int *imgtype,int *status)

{
  int iVar1;
  fitsfile *in_RDX;
  int *in_RDI;
  void *unaff_retaddr;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  fitsfile *in_stack_00000058;
  int *in_stack_000000e0;
  fitsfile *in_stack_000000e8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX->HDUposition < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000e8,in_stack_000000e0), 0 < iVar1)) {
        return in_RDX->HDUposition;
      }
    }
    else {
      ffmahd(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
    }
    ffmaky(in_RDX,in_stack_ffffffffffffffdc,(int *)0x18b810);
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffgky(fptr,imgtype._4_4_,(char *)status,unaff_retaddr,
            (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    else if (*(int *)(*(long *)(in_RDI + 2) + 0x47c) == 0) {
      in_RDX->HDUposition = 0xe9;
    }
    else {
      ffgky(fptr,imgtype._4_4_,(char *)status,unaff_retaddr,
            (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    iVar1 = in_RDX->HDUposition;
  }
  else {
    iVar1 = in_RDX->HDUposition;
  }
  return iVar1;
}

Assistant:

int ffgidt( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *imgtype,   /* O - image data type                         */
            int  *status)    /* IO - error status                           */
/*
  Get the datatype of the image (= BITPIX keyword for normal image, or
  ZBITPIX for a compressed image)
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    /* reset to beginning of header */
    ffmaky(fptr, 1, status);  /* simply move to beginning of header */

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffgky(fptr, TINT, "BITPIX", imgtype, NULL, status);
    }
    else if ((fptr->Fptr)->compressimg)
    {
        /* this is a binary table containing a compressed image */
        ffgky(fptr, TINT, "ZBITPIX", imgtype, NULL, status);
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}